

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::ProcessCompactBlockTxns
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,BlockTransactions *block_transactions)

{
  long lVar1;
  PartiallyDownloadedBlock *this_00;
  bool bVar2;
  ReadStatus RVar3;
  difference_type dVar4;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  __first;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  __last;
  string *message;
  _Self __tmp;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  optional<long> from_peer;
  optional<long> from_peer_00;
  optional<long> from_peer_01;
  string_view source_file_00;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar8;
  uint local_9c;
  shared_ptr<CBlock> pblock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  string local_78;
  vector<CInv,_std::allocator<CInv>_> invs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_shared<CBlock>();
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock75,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xe2b,false);
  pVar8 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::equal_range(&this->mapBlocksInFlight,&block_transactions->blockhash);
  __last = pVar8.second._M_node;
  __first = pVar8.first._M_node;
  _Var5._M_node = __last._M_node;
  dVar4 = std::
          distance<std::_Rb_tree_iterator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                    (__first,__last);
  if (dVar4 == 0) {
    lVar6 = pfrom->id;
    bVar7 = true;
  }
  else {
    lVar6 = pfrom->id;
    bVar7 = *(long *)(__first._M_node + 2) == lVar6;
  }
  do {
    if (__first._M_node == __last._M_node) {
      bVar7 = ::LogAcceptCategory(NET,(Level)_Var5._M_node);
      if (bVar7) {
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pfrom->id;
        logging_function._M_str = "ProcessCompactBlockTxns";
        logging_function._M_len = 0x17;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,0xe3e,NET,Debug,(ConstevalFormatString<1U>)0x68b683,
                   (long *)&invs);
      }
LAB_001b26af:
      bVar7 = true;
      bVar2 = true;
LAB_001b26b2:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock75.super_unique_lock);
      if (!bVar7 && !bVar2) {
        std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
                  ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&invs,
                   &pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
        ProcessBlock(this,pfrom,(shared_ptr<const_CBlock> *)&invs,true,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    if ((*(long *)(__first._M_node + 2) == lVar6) &&
       (this_00 = (PartiallyDownloadedBlock *)(__first._M_node[2]._M_parent)->_M_right,
       this_00 != (PartiallyDownloadedBlock *)0x0)) {
      RVar3 = PartiallyDownloadedBlock::FillBlock
                        (this_00,pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,&block_transactions->txn);
      if (RVar3 != READ_STATUS_FAILED) {
        if (RVar3 == READ_STATUS_INVALID) {
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = 1;
          from_peer.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload =
               (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
          RemoveBlockRequest(this,&block_transactions->blockhash,from_peer);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&invs,"invalid compact block/non-matching block transactions",
                     (allocator<char> *)&local_9c);
          Misbehaving((PeerManagerImpl *)peer,(Peer *)&invs,message);
          std::__cxx11::string::~string((string *)&invs);
          goto LAB_001b26af;
        }
        from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ = 1;
        from_peer_00.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload =
             (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
        RemoveBlockRequest(this,&block_transactions->blockhash,from_peer_00);
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pfrom->id;
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        std::
        _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
        ::_M_emplace_unique<uint256_const&,std::pair<long,bool>>
                  ((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                    *)&this->mapBlockSource,&block_transactions->blockhash,(pair<long,_bool> *)&invs
                  );
        bVar7 = false;
        bVar2 = false;
        goto LAB_001b26b2;
      }
      if (bVar7) {
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_9c = ((uint)(peer->m_their_services)._M_i & 8) << 0x1b | 2;
        std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256_const&>
                  ((vector<CInv,std::allocator<CInv>> *)&invs,&local_9c,
                   &block_transactions->blockhash);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"getdata",(allocator<char> *)&local_9c);
        (anonymous_namespace)::PeerManagerImpl::
        MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                  ((PeerManagerImpl *)this,pfrom,&local_78,&invs);
        std::__cxx11::string::~string((string *)&local_78);
        std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
                  (&invs.super__Vector_base<CInv,_std::allocator<CInv>_>);
        bVar2 = true;
        bVar7 = false;
        goto LAB_001b26b2;
      }
      from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = 1;
      from_peer_01.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload =
           (_Storage<long,_true>)(_Storage<long,_true>)pfrom->id;
      RemoveBlockRequest(this,&block_transactions->blockhash,from_peer_01);
      bVar2 = ::LogAcceptCategory(NET,(Level)block_transactions);
      bVar7 = true;
      if (bVar2) {
        invs.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)pfrom->id;
        logging_function_00._M_str = "ProcessCompactBlockTxns";
        logging_function_00._M_len = 0x17;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_00._M_len = 0x62;
        LogPrintFormatInternal<long>
                  (logging_function_00,source_file_00,0xe50,NET,Debug,
                   (ConstevalFormatString<1U>)0x68b6fc,(long *)&invs);
        goto LAB_001b26af;
      }
      bVar2 = true;
      goto LAB_001b26b2;
    }
    __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
  } while( true );
}

Assistant:

void PeerManagerImpl::ProcessCompactBlockTxns(CNode& pfrom, Peer& peer, const BlockTransactions& block_transactions)
{
    std::shared_ptr<CBlock> pblock = std::make_shared<CBlock>();
    bool fBlockRead{false};
    {
        LOCK(cs_main);

        auto range_flight = mapBlocksInFlight.equal_range(block_transactions.blockhash);
        size_t already_in_flight = std::distance(range_flight.first, range_flight.second);
        bool requested_block_from_this_peer{false};

        // Multimap ensures ordering of outstanding requests. It's either empty or first in line.
        bool first_in_flight = already_in_flight == 0 || (range_flight.first->second.first == pfrom.GetId());

        while (range_flight.first != range_flight.second) {
            auto [node_id, block_it] = range_flight.first->second;
            if (node_id == pfrom.GetId() && block_it->partialBlock) {
                requested_block_from_this_peer = true;
                break;
            }
            range_flight.first++;
        }

        if (!requested_block_from_this_peer) {
            LogDebug(BCLog::NET, "Peer %d sent us block transactions for block we weren't expecting\n", pfrom.GetId());
            return;
        }

        PartiallyDownloadedBlock& partialBlock = *range_flight.first->second.second->partialBlock;
        ReadStatus status = partialBlock.FillBlock(*pblock, block_transactions.txn);
        if (status == READ_STATUS_INVALID) {
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // Reset in-flight state in case Misbehaving does not result in a disconnect
            Misbehaving(peer, "invalid compact block/non-matching block transactions");
            return;
        } else if (status == READ_STATUS_FAILED) {
            if (first_in_flight) {
                // Might have collided, fall back to getdata now :(
                std::vector<CInv> invs;
                invs.emplace_back(MSG_BLOCK | GetFetchFlags(peer), block_transactions.blockhash);
                MakeAndPushMessage(pfrom, NetMsgType::GETDATA, invs);
            } else {
                RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId());
                LogDebug(BCLog::NET, "Peer %d sent us a compact block but it failed to reconstruct, waiting on first download to complete\n", pfrom.GetId());
                return;
            }
        } else {
            // Block is either okay, or possibly we received
            // READ_STATUS_CHECKBLOCK_FAILED.
            // Note that CheckBlock can only fail for one of a few reasons:
            // 1. bad-proof-of-work (impossible here, because we've already
            //    accepted the header)
            // 2. merkleroot doesn't match the transactions given (already
            //    caught in FillBlock with READ_STATUS_FAILED, so
            //    impossible here)
            // 3. the block is otherwise invalid (eg invalid coinbase,
            //    block is too big, too many legacy sigops, etc).
            // So if CheckBlock failed, #3 is the only possibility.
            // Under BIP 152, we don't discourage the peer unless proof of work is
            // invalid (we don't require all the stateless checks to have
            // been run).  This is handled below, so just treat this as
            // though the block was successfully read, and rely on the
            // handling in ProcessNewBlock to ensure the block index is
            // updated, etc.
            RemoveBlockRequest(block_transactions.blockhash, pfrom.GetId()); // it is now an empty pointer
            fBlockRead = true;
            // mapBlockSource is used for potentially punishing peers and
            // updating which peers send us compact blocks, so the race
            // between here and cs_main in ProcessNewBlock is fine.
            // BIP 152 permits peers to relay compact blocks after validating
            // the header only; we should not punish peers if the block turns
            // out to be invalid.
            mapBlockSource.emplace(block_transactions.blockhash, std::make_pair(pfrom.GetId(), false));
        }
    } // Don't hold cs_main when we call into ProcessNewBlock
    if (fBlockRead) {
        // Since we requested this block (it was in mapBlocksInFlight), force it to be processed,
        // even if it would not be a candidate for new tip (missing previous block, chain not long enough, etc)
        // This bypasses some anti-DoS logic in AcceptBlock (eg to prevent
        // disk-space attacks), but this should be safe due to the
        // protections in the compact block handler -- see related comment
        // in compact block optimistic reconstruction handling.
        ProcessBlock(pfrom, pblock, /*force_processing=*/true, /*min_pow_checked=*/true);
    }
    return;
}